

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeFormatter.cpp
# Opt level: O2

void __thiscall
cali::TreeFormatter::TreeFormatterImpl::add
          (TreeFormatterImpl *this,CaliperMetadataAccessInterface *db,EntryList *list)

{
  int iVar1;
  SnapshotTreeNode *pSVar2;
  iterator iVar3;
  iterator iVar4;
  undefined4 extraout_var;
  _Rb_tree<cali::Attribute,std::pair<cali::Attribute_const,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>,std::_Select1st<std::pair<cali::Attribute_const,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>>,std::less<cali::Attribute>,std::allocator<std::pair<cali::Attribute_const,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>>>
  *this_00;
  pointer __k;
  string name;
  vector<cali::Attribute,_std::allocator<cali::Attribute>_> path_keys;
  ColumnInfo ci;
  allocator<char> local_131;
  pointer local_130;
  pointer local_128;
  CaliperMetadataAccessInterface *local_120;
  _Rb_tree<cali::Attribute,std::pair<cali::Attribute_const,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>,std::_Select1st<std::pair<cali::Attribute_const,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>>,std::less<cali::Attribute>,std::allocator<std::pair<cali::Attribute_const,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>>>
  *local_118;
  _Base_ptr local_110;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_108;
  pointer local_100;
  Attribute local_f8;
  string local_f0;
  undefined1 local_d0 [8];
  int local_c8;
  cali_variant_t local_a0;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_120 = db;
  if (this->m_use_nested == true) {
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    local_60 = std::
               _Function_handler<bool_(const_cali::Attribute_&,_const_cali::Variant_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/reader/TreeFormatter.cpp:148:47)>
               ::_M_invoke;
    local_68 = std::
               _Function_handler<bool_(const_cali::Attribute_&,_const_cali::Variant_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/reader/TreeFormatter.cpp:148:47)>
               ::_M_manager;
    pSVar2 = SnapshotTree::add_snapshot(&this->m_tree,db,list,(IsPathPredicateFn *)&local_78);
    std::_Function_base::~_Function_base((_Function_base *)&local_78);
  }
  else {
    get_path_keys((vector<cali::Attribute,_std::allocator<cali::Attribute>_> *)local_d0,this,db);
    local_50._8_8_ = 0;
    local_38 = std::
               _Function_handler<bool_(const_cali::Attribute_&,_const_cali::Variant_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/reader/TreeFormatter.cpp:152:50)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<bool_(const_cali::Attribute_&,_const_cali::Variant_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/reader/TreeFormatter.cpp:152:50)>
               ::_M_manager;
    local_50._M_unused._M_object =
         (vector<cali::Attribute,_std::allocator<cali::Attribute>_> *)local_d0;
    pSVar2 = SnapshotTree::add_snapshot(&this->m_tree,db,list,(IsPathPredicateFn *)&local_50);
    std::_Function_base::~_Function_base((_Function_base *)&local_50);
    std::_Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_>::~_Vector_base
              ((_Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_> *)local_d0);
  }
  if (pSVar2 != (SnapshotTreeNode *)0x0) {
    local_130 = (pSVar2->m_records).
                super__Vector_base<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>,_std::allocator<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    this_00 = (_Rb_tree<cali::Attribute,std::pair<cali::Attribute_const,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>,std::_Select1st<std::pair<cali::Attribute_const,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>>,std::less<cali::Attribute>,std::allocator<std::pair<cali::Attribute_const,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>>>
               *)&this->m_column_info;
    local_108 = &(this->m_spec).aliases;
    local_110 = &(this->m_spec).aliases._M_t._M_impl.super__Rb_tree_header._M_header;
    local_118 = this_00;
    for (local_128 = (pSVar2->m_records).
                     super__Vector_base<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>,_std::allocator<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; local_128 != local_130;
        local_128 = local_128 + 1) {
      local_100 = (local_128->
                  super__Vector_base<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      for (__k = (local_128->
                 super__Vector_base<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; __k != local_100; __k = __k + 1) {
        Variant::to_string_abi_cxx11_((string *)local_d0,&__k->second);
        iVar1 = local_c8;
        std::__cxx11::string::~string((string *)local_d0);
        iVar3 = std::
                _Rb_tree<cali::Attribute,_std::pair<const_cali::Attribute,_cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>,_std::_Select1st<std::pair<const_cali::Attribute,_cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>_>,_std::less<cali::Attribute>,_std::allocator<std::pair<const_cali::Attribute,_cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>_>_>
                ::find((_Rb_tree<cali::Attribute,_std::pair<const_cali::Attribute,_cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>,_std::_Select1st<std::pair<const_cali::Attribute,_cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>_>,_std::less<cali::Attribute>,_std::allocator<std::pair<const_cali::Attribute,_cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>_>_>
                        *)this_00,&__k->first);
        if ((_Rb_tree_header *)iVar3._M_node ==
            &(this->m_column_info)._M_t._M_impl.super__Rb_tree_header) {
          Attribute::name_abi_cxx11_(&local_f0,&__k->first);
          iVar4 = CaliperMetadataDB::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_108,(key_type *)&local_f0);
          if (iVar4._M_node == local_110) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_d0,"attribute.alias",&local_131);
            iVar1 = (*local_120->_vptr_CaliperMetadataAccessInterface[2])
                              (local_120,
                               (pair<cali::Attribute,_cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>
                                *)local_d0);
            local_f8.m_node = (Node *)CONCAT44(extraout_var,iVar1);
            local_a0 = (cali_variant_t)Attribute::get(&__k->first,&local_f8);
            std::__cxx11::string::~string((string *)local_d0);
            if ((pointer)local_a0.type_and_size != (pointer)0x0) {
              Variant::to_string_abi_cxx11_((string *)local_d0,(Variant *)&local_a0);
              std::__cxx11::string::operator=((string *)&local_f0,(string *)local_d0);
              std::__cxx11::string::~string((string *)local_d0);
            }
          }
          else {
            std::__cxx11::string::_M_assign((string *)&local_f0);
          }
          std::__cxx11::string::string((string *)&local_a0,(string *)&local_f0);
          std::pair<cali::Attribute,_cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>::
          pair<cali::TreeFormatter::TreeFormatterImpl::ColumnInfo_&,_true>
                    ((pair<cali::Attribute,_cali::TreeFormatter::TreeFormatterImpl::ColumnInfo> *)
                     local_d0,&__k->first,(ColumnInfo *)&local_a0);
          this_00 = local_118;
          std::
          _Rb_tree<cali::Attribute,std::pair<cali::Attribute_const,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>,std::_Select1st<std::pair<cali::Attribute_const,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>>,std::less<cali::Attribute>,std::allocator<std::pair<cali::Attribute_const,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>>>
          ::
          _M_emplace_unique<std::pair<cali::Attribute,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>>
                    (local_118,
                     (pair<cali::Attribute,_cali::TreeFormatter::TreeFormatterImpl::ColumnInfo> *)
                     local_d0);
          std::__cxx11::string::~string((string *)&local_c8);
          std::__cxx11::string::~string((string *)&local_a0);
          std::__cxx11::string::~string((string *)&local_f0);
        }
        else {
          if (iVar1 < *(int *)&iVar3._M_node[2]._M_parent) {
            iVar1 = *(int *)&iVar3._M_node[2]._M_parent;
          }
          *(int *)&iVar3._M_node[2]._M_parent = iVar1;
        }
      }
    }
  }
  return;
}

Assistant:

void add(const CaliperMetadataAccessInterface& db, const EntryList& list)
    {
        const SnapshotTreeNode* node = nullptr;

        if (m_use_nested) {
            node =
                m_tree.add_snapshot(db, list, [](const Attribute& attr, const Variant&) { return attr.is_nested(); });
        } else {
            auto path_keys = get_path_keys(db);

            node = m_tree.add_snapshot(db, list, [&path_keys](const Attribute& attr, const Variant&) {
                return (std::find(std::begin(path_keys), std::end(path_keys), attr) != std::end(path_keys));
            });
        }

        if (!node)
            return;

        // update column widths

        for (auto& data : node->records()) {
            for (auto& entry : data) {
                int  len = entry.second.to_string().size();
                auto it  = m_column_info.find(entry.first);

                if (it == m_column_info.end()) {
                    std::string name = entry.first.name();

                    auto ait = m_spec.aliases.find(name);
                    if (ait != m_spec.aliases.end())
                        name = ait->second;
                    else {
                        Variant v = entry.first.get(db.get_attribute("attribute.alias"));

                        if (!v.empty())
                            name = v.to_string();
                    }

                    ColumnInfo ci { name, std::max<int>(len, name.size()) };

                    m_column_info.insert(std::make_pair(entry.first, ci));
                } else
                    it->second.width = std::max(it->second.width, len);
            }
        }
    }